

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

bool __thiscall CoreML::NeuralNetworkShaper::AllShapesDone(NeuralNetworkShaper *this)

{
  int iVar1;
  _Self __tmp;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_header *p_Var3;
  
  iVar1 = this->numColors;
  p_Var3 = &(this->blobColors)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->blobColors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != p_Var3 && (iVar1 == *(int *)&p_Var2[3]._M_parent));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
  }
  return (_Rb_tree_header *)p_Var2 == p_Var3;
}

Assistant:

bool NeuralNetworkShaper::AllShapesDone() {
    for (auto it = blobColors.begin(); it != blobColors.end(); it++) {
        if (static_cast<int>(it->second.size()) != numColors) {
            return false;
        }
    }
    return true;
}